

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O2

NODE * deletemin(NODE **p)

{
  NODE *pNVar1;
  NODE *pNVar2;
  node **ppnVar3;
  
  pNVar1 = *p;
  do {
    ppnVar3 = p;
    pNVar2 = pNVar1;
    pNVar1 = pNVar2->left;
    p = &pNVar2->left;
  } while (pNVar2->left != (node *)0x0);
  *ppnVar3 = pNVar2->right;
  return pNVar2;
}

Assistant:

NODE *deletemin(NODE **p) {
  NODE *x;
  while ((*p)->left != NULL) {
    p = &(*p)->left;
  }

  x = *p;
  *p = (*p)->right;
  return x;
}